

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

size_t ZSTD_buildEntropyStatisticsAndEstimateSubBlockSize(seqStore_t *seqStore,ZSTD_CCtx *zc)

{
  uint uVar1;
  int *litSize;
  BYTE *ofCodeTable;
  ZSTD_entropyCTablesMetadata_t *unaff_RBX;
  BYTE *in_RSI;
  ZSTD_CCtx_params *unaff_retaddr;
  ZSTD_entropyCTables_t *in_stack_00000008;
  int in_stack_00000010;
  undefined4 in_stack_00000014;
  int in_stack_00000018;
  undefined4 in_stack_0000001c;
  size_t in_stack_00000030;
  size_t err_code;
  ZSTD_entropyCTablesMetadata_t *entropyMetadata;
  undefined4 in_stack_ffffffffffffffbc;
  undefined4 in_stack_ffffffffffffffc4;
  BYTE *in_stack_ffffffffffffffc8;
  ZSTD_entropyCTables_t *in_stack_fffffffffffffff0;
  
  litSize = (int *)(in_RSI + 0x1320);
  ofCodeTable = (BYTE *)ZSTD_buildBlockEntropyStats
                                  ((seqStore_t *)CONCAT44(in_stack_0000001c,in_stack_00000018),
                                   (ZSTD_entropyCTables_t *)
                                   CONCAT44(in_stack_00000014,in_stack_00000010),in_stack_00000008,
                                   unaff_retaddr,unaff_RBX,in_stack_fffffffffffffff0,
                                   in_stack_00000030);
  uVar1 = ERR_isError((size_t)ofCodeTable);
  if (uVar1 == 0) {
    ofCodeTable = (BYTE *)ZSTD_estimateBlockSize
                                    (in_RSI,(size_t)litSize,ofCodeTable,in_stack_ffffffffffffffc8,
                                     (BYTE *)CONCAT44(in_stack_ffffffffffffffc4,1),
                                     CONCAT44(in_stack_ffffffffffffffbc,(uint)(*litSize == 2)),
                                     in_stack_fffffffffffffff0,unaff_RBX,unaff_retaddr,
                                     (size_t)in_stack_00000008,in_stack_00000010,in_stack_00000018);
  }
  return (size_t)ofCodeTable;
}

Assistant:

static size_t
ZSTD_buildEntropyStatisticsAndEstimateSubBlockSize(seqStore_t* seqStore, ZSTD_CCtx* zc)
{
    ZSTD_entropyCTablesMetadata_t* const entropyMetadata = &zc->blockSplitCtx.entropyMetadata;
    DEBUGLOG(6, "ZSTD_buildEntropyStatisticsAndEstimateSubBlockSize()");
    FORWARD_IF_ERROR(ZSTD_buildBlockEntropyStats(seqStore,
                    &zc->blockState.prevCBlock->entropy,
                    &zc->blockState.nextCBlock->entropy,
                    &zc->appliedParams,
                    entropyMetadata,
                    zc->entropyWorkspace, ENTROPY_WORKSPACE_SIZE), "");
    return ZSTD_estimateBlockSize(
                    seqStore->litStart, (size_t)(seqStore->lit - seqStore->litStart),
                    seqStore->ofCode, seqStore->llCode, seqStore->mlCode,
                    (size_t)(seqStore->sequences - seqStore->sequencesStart),
                    &zc->blockState.nextCBlock->entropy,
                    entropyMetadata,
                    zc->entropyWorkspace, ENTROPY_WORKSPACE_SIZE,
                    (int)(entropyMetadata->hufMetadata.hType == set_compressed), 1);
}